

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall SuiteMessageTests::Testcopy::~Testcopy(Testcopy *this)

{
  Testcopy *this_local;
  
  ~Testcopy(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(copy)
{
  FIX::Message object;
  FIX::MDReqID mdReqID( "MARKETDATAID" );
  FIX::SubscriptionRequestType subType( FIX::SubscriptionRequestType_SNAPSHOT );
  FIX::MarketDepth marketDepth( 0 );

  FIX44::MarketDataRequest::NoMDEntryTypes marketDataEntryGroup;
  FIX::MDEntryType mdEntryType( FIX::MDEntryType_BID );
  marketDataEntryGroup.set( mdEntryType );

  FIX44::MarketDataRequest::NoRelatedSym symbolGroup;
  FIX::Symbol symbol( "LNUX" );
  symbolGroup.set( symbol );

  FIX44::MarketDataRequest message( mdReqID, subType, marketDepth );
  message.addGroup( marketDataEntryGroup );
  message.addGroup( symbolGroup );

  FIX::Message copy = object;
  FIX::Message copy2 = copy;

  CHECK_EQUAL( object.toString(), copy.toString() );
  CHECK_EQUAL( object.toString(), copy2.toString() );
}